

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int cm_zlib_deflateTune(z_streamp strm,int good_length,int max_lazy,int nice_length,int max_chain)

{
  internal_state *piVar1;
  int iVar2;
  deflate_state *s;
  int max_chain_local;
  int nice_length_local;
  int max_lazy_local;
  int good_length_local;
  z_streamp strm_local;
  
  iVar2 = deflateStateCheck(strm);
  if (iVar2 == 0) {
    piVar1 = strm->state;
    piVar1->good_match = good_length;
    piVar1->max_lazy_match = max_lazy;
    piVar1->nice_match = nice_length;
    piVar1->max_chain_length = max_chain;
    strm_local._4_4_ = 0;
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT deflateTune(z_streamp strm, int good_length, int max_lazy,
                        int nice_length, int max_chain) {
    deflate_state *s;

    if (deflateStateCheck(strm)) return Z_STREAM_ERROR;
    s = strm->state;
    s->good_match = (uInt)good_length;
    s->max_lazy_match = (uInt)max_lazy;
    s->nice_match = nice_length;
    s->max_chain_length = (uInt)max_chain;
    return Z_OK;
}